

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic.hpp
# Opt level: O3

hugeint_t duckdb::GetInternalCValue<duckdb::hugeint_t,duckdb::TryCast>
                    (duckdb_result *result,idx_t col,idx_t row)

{
  bool bVar1;
  hugeint_t hVar2;
  hugeint_t local_28;
  
  bVar1 = CanFetchValue(result,col,row);
  if (bVar1) {
    switch(result->deprecated_columns[col].deprecated_type) {
    case DUCKDB_TYPE_BOOLEAN:
      hVar2 = TryCastCInternal<bool,duckdb::hugeint_t,duckdb::TryCast>(result,col,row);
      return hVar2;
    case DUCKDB_TYPE_TINYINT:
      hVar2 = TryCastCInternal<signed_char,duckdb::hugeint_t,duckdb::TryCast>(result,col,row);
      return hVar2;
    case DUCKDB_TYPE_SMALLINT:
      hVar2 = TryCastCInternal<short,duckdb::hugeint_t,duckdb::TryCast>(result,col,row);
      return hVar2;
    case DUCKDB_TYPE_INTEGER:
      hVar2 = TryCastCInternal<int,duckdb::hugeint_t,duckdb::TryCast>(result,col,row);
      return hVar2;
    case DUCKDB_TYPE_BIGINT:
      hVar2 = TryCastCInternal<long,duckdb::hugeint_t,duckdb::TryCast>(result,col,row);
      return hVar2;
    case DUCKDB_TYPE_UTINYINT:
      hVar2 = TryCastCInternal<unsigned_char,duckdb::hugeint_t,duckdb::TryCast>(result,col,row);
      return hVar2;
    case DUCKDB_TYPE_USMALLINT:
      hVar2 = TryCastCInternal<unsigned_short,duckdb::hugeint_t,duckdb::TryCast>(result,col,row);
      return hVar2;
    case DUCKDB_TYPE_UINTEGER:
      hVar2 = TryCastCInternal<unsigned_int,duckdb::hugeint_t,duckdb::TryCast>(result,col,row);
      return hVar2;
    case DUCKDB_TYPE_UBIGINT:
      hVar2 = TryCastCInternal<unsigned_long,duckdb::hugeint_t,duckdb::TryCast>(result,col,row);
      return hVar2;
    case DUCKDB_TYPE_FLOAT:
      hVar2 = TryCastCInternal<float,duckdb::hugeint_t,duckdb::TryCast>(result,col,row);
      return hVar2;
    case DUCKDB_TYPE_DOUBLE:
      hVar2 = TryCastCInternal<double,duckdb::hugeint_t,duckdb::TryCast>(result,col,row);
      return hVar2;
    case DUCKDB_TYPE_TIMESTAMP:
      hVar2 = TryCastCInternal<duckdb::timestamp_t,duckdb::hugeint_t,duckdb::TryCast>
                        (result,col,row);
      return hVar2;
    case DUCKDB_TYPE_DATE:
      hVar2 = TryCastCInternal<duckdb::date_t,duckdb::hugeint_t,duckdb::TryCast>(result,col,row);
      return hVar2;
    case DUCKDB_TYPE_TIME:
      hVar2 = TryCastCInternal<duckdb::dtime_t,duckdb::hugeint_t,duckdb::TryCast>(result,col,row);
      return hVar2;
    case DUCKDB_TYPE_INTERVAL:
      hVar2 = TryCastCInternal<duckdb::interval_t,duckdb::hugeint_t,duckdb::TryCast>(result,col,row)
      ;
      return hVar2;
    case DUCKDB_TYPE_HUGEINT:
      hVar2 = TryCastCInternal<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::TryCast>(result,col,row);
      return hVar2;
    case DUCKDB_TYPE_VARCHAR:
      hVar2 = TryCastCInternal<char*,duckdb::hugeint_t,duckdb::FromCStringCastWrapper<duckdb::TryCast>>
                        (result,col,row);
      return hVar2;
    case DUCKDB_TYPE_BLOB:
      hVar2 = TryCastCInternal<duckdb_blob,duckdb::hugeint_t,duckdb::FromCBlobCastWrapper>
                        (result,col,row);
      return hVar2;
    case DUCKDB_TYPE_DECIMAL:
      hVar2 = TryCastDecimalCInternal<duckdb::hugeint_t>(result,col,row);
      return hVar2;
    case DUCKDB_TYPE_UHUGEINT:
      hVar2 = TryCastCInternal<duckdb::uhugeint_t,duckdb::hugeint_t,duckdb::TryCast>(result,col,row)
      ;
      return hVar2;
    }
  }
  hugeint_t::hugeint_t(&local_28,0);
  return local_28;
}

Assistant:

RESULT_TYPE GetInternalCValue(duckdb_result *result, idx_t col, idx_t row) {
	if (!CanFetchValue(result, col, row)) {
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	}
	switch (result->deprecated_columns[col].deprecated_type) {
	case DUCKDB_TYPE_BOOLEAN:
		return TryCastCInternal<bool, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_TINYINT:
		return TryCastCInternal<int8_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_SMALLINT:
		return TryCastCInternal<int16_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_INTEGER:
		return TryCastCInternal<int32_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_BIGINT:
		return TryCastCInternal<int64_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UTINYINT:
		return TryCastCInternal<uint8_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_USMALLINT:
		return TryCastCInternal<uint16_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UINTEGER:
		return TryCastCInternal<uint32_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UBIGINT:
		return TryCastCInternal<uint64_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_FLOAT:
		return TryCastCInternal<float, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_DOUBLE:
		return TryCastCInternal<double, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_DATE:
		return TryCastCInternal<date_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_TIME:
		return TryCastCInternal<dtime_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_TIMESTAMP:
		return TryCastCInternal<timestamp_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_HUGEINT:
		return TryCastCInternal<hugeint_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_UHUGEINT:
		return TryCastCInternal<uhugeint_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_DECIMAL:
		return TryCastDecimalCInternal<RESULT_TYPE>(result, col, row);
	case DUCKDB_TYPE_INTERVAL:
		return TryCastCInternal<interval_t, RESULT_TYPE, OP>(result, col, row);
	case DUCKDB_TYPE_VARCHAR:
		return TryCastCInternal<char *, RESULT_TYPE, FromCStringCastWrapper<OP>>(result, col, row);
	case DUCKDB_TYPE_BLOB:
		return TryCastCInternal<duckdb_blob, RESULT_TYPE, FromCBlobCastWrapper>(result, col, row);
	default: { // LCOV_EXCL_START
		// Invalid type for C to C++ conversion. Internally, we set the null mask to NULL.
		// This is a deprecated code path. Use the Vector Interface for nested and complex types.
		return FetchDefaultValue::Operation<RESULT_TYPE>();
	} // LCOV_EXCL_STOP
	}
}